

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::
EachMatcher<iutest::detail::ElementsAreMatcher<iutest::detail::LtMatcher<int>,_iutest::detail::LtMatcher<int>_>_>
::~EachMatcher(EachMatcher<iutest::detail::ElementsAreMatcher<iutest::detail::LtMatcher<int>,_iutest::detail::LtMatcher<int>_>_>
               *this)

{
  EachMatcher<iutest::detail::ElementsAreMatcher<iutest::detail::LtMatcher<int>,_iutest::detail::LtMatcher<int>_>_>
  *this_local;
  
  ~EachMatcher(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

class EachMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    explicit EachMatcher(const T& expected) : m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        IUTEST_USING_BEGIN_END();
        if IUTEST_COND_LIKELY( Each(begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Each: " << m_expected;
        return strm.str();
    }